

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ObjExporter.cpp
# Opt level: O2

void __thiscall Assimp::ObjExporter::~ObjExporter(ObjExporter *this)

{
  std::__cxx11::string::~string((string *)&this->endl);
  std::vector<Assimp::ObjExporter::MeshInstance,_std::allocator<Assimp::ObjExporter::MeshInstance>_>
  ::~vector(&this->mMeshes);
  std::
  _Rb_tree<Assimp::ObjExporter::vertexData,_std::pair<const_Assimp::ObjExporter::vertexData,_int>,_std::_Select1st<std::pair<const_Assimp::ObjExporter::vertexData,_int>_>,_Assimp::ObjExporter::vertexDataCompare,_std::allocator<std::pair<const_Assimp::ObjExporter::vertexData,_int>_>_>
  ::~_Rb_tree(&(this->mVpMap).vecMap._M_t);
  std::
  _Rb_tree<aiVector3t<float>,_std::pair<const_aiVector3t<float>,_int>,_std::_Select1st<std::pair<const_aiVector3t<float>,_int>_>,_Assimp::ObjExporter::aiVectorCompare,_std::allocator<std::pair<const_aiVector3t<float>,_int>_>_>
  ::~_Rb_tree(&(this->mVtMap).vecMap._M_t);
  std::
  _Rb_tree<aiVector3t<float>,_std::pair<const_aiVector3t<float>,_int>,_std::_Select1st<std::pair<const_aiVector3t<float>,_int>_>,_Assimp::ObjExporter::aiVectorCompare,_std::allocator<std::pair<const_aiVector3t<float>,_int>_>_>
  ::~_Rb_tree(&(this->mVnMap).vecMap._M_t);
  std::
  _Vector_base<Assimp::ObjExporter::vertexData,_std::allocator<Assimp::ObjExporter::vertexData>_>::
  ~_Vector_base(&(this->vp).
                 super__Vector_base<Assimp::ObjExporter::vertexData,_std::allocator<Assimp::ObjExporter::vertexData>_>
               );
  std::_Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>::~_Vector_base
            (&(this->vc).super__Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>);
  std::_Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::~_Vector_base
            (&(this->vt).super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>)
  ;
  std::_Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::~_Vector_base
            (&(this->vn).super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>)
  ;
  std::__cxx11::string::~string((string *)&this->filename);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&this->mOutputMat);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)this);
  return;
}

Assistant:

ObjExporter::~ObjExporter() {
    // empty
}